

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O0

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddLessThan(InstructionBuilder *this,uint32_t op1,uint32_t op2)

{
  bool bVar1;
  uint32_t id;
  int iVar2;
  DefUseManager *this_00;
  Instruction *this_01;
  IRContext *this_02;
  TypeManager *this_03;
  Type *pTVar3;
  undefined4 extraout_var;
  Integer *int_type;
  Type *type;
  Instruction *op1_insn;
  uint32_t op2_local;
  uint32_t op1_local;
  InstructionBuilder *this_local;
  
  this_00 = IRContext::get_def_use_mgr(this->context_);
  this_01 = analysis::DefUseManager::GetDef(this_00,op1);
  this_02 = GetContext(this);
  this_03 = IRContext::get_type_mgr(this_02);
  id = opt::Instruction::type_id(this_01);
  pTVar3 = analysis::TypeManager::GetType(this_03,id);
  iVar2 = (*pTVar3->_vptr_Type[9])();
  if ((Integer *)CONCAT44(extraout_var,iVar2) == (Integer *)0x0) {
    __assert_fail("int_type && \"Operand is not of int type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/ir_builder.h"
                  ,0x157,
                  "Instruction *spvtools::opt::InstructionBuilder::AddLessThan(uint32_t, uint32_t)")
    ;
  }
  bVar1 = analysis::Integer::IsSigned((Integer *)CONCAT44(extraout_var,iVar2));
  if (bVar1) {
    this_local = (InstructionBuilder *)AddSLessThan(this,op1,op2);
  }
  else {
    this_local = (InstructionBuilder *)AddULessThan(this,op1,op2);
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* AddLessThan(uint32_t op1, uint32_t op2) {
    Instruction* op1_insn = context_->get_def_use_mgr()->GetDef(op1);
    analysis::Type* type =
        GetContext()->get_type_mgr()->GetType(op1_insn->type_id());
    analysis::Integer* int_type = type->AsInteger();
    assert(int_type && "Operand is not of int type");

    if (int_type->IsSigned())
      return AddSLessThan(op1, op2);
    else
      return AddULessThan(op1, op2);
  }